

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_base_active_by_fd(event_base *base,int fd,short events)

{
  event *ev_00;
  common_timeout_list *ctl;
  event *ev;
  uint u;
  int i;
  short events_local;
  int fd_local;
  event_base *base_local;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if ((events & 1U) == 0) {
    evmap_io_active_(base,fd,events & 0x86);
  }
  else {
    for (ev._0_4_ = 0; (uint)ev < (base->timeheap).n; ev._0_4_ = (uint)ev + 1) {
      ev_00 = (base->timeheap).p[(uint)ev];
      if (ev_00->ev_fd == fd) {
        event_active_nolock_(ev_00,1,1);
      }
    }
    for (ev._4_4_ = 0; ev._4_4_ < base->n_common_timeouts; ev._4_4_ = ev._4_4_ + 1) {
      for (ctl = (common_timeout_list *)(base->common_timeout_queues[ev._4_4_]->events).tqh_first;
          ctl != (common_timeout_list *)0x0;
          ctl = (common_timeout_list *)(ctl->timeout_event).ev_evcallback.evcb_active_next.tqe_prev)
      {
        if (*(int *)&(ctl->timeout_event).ev_evcallback.evcb_cb_union == fd) {
          event_active_nolock_((event *)ctl,1,1);
        }
      }
    }
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return;
}

Assistant:

void
event_base_active_by_fd(struct event_base *base, evutil_socket_t fd, short events)
{
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	/* Activate any non timer events */
	if (!(events & EV_TIMEOUT)) {
		evmap_io_active_(base, fd, events & (EV_READ|EV_WRITE|EV_CLOSED));
	} else {
		/* If we want to activate timer events, loop and activate each event with
		 * the same fd in both the timeheap and common timeouts list */
		int i;
		unsigned u;
		struct event *ev;

		for (u = 0; u < base->timeheap.n; ++u) {
			ev = base->timeheap.p[u];
			if (ev->ev_fd == fd) {
				event_active_nolock_(ev, EV_TIMEOUT, 1);
			}
		}

		for (i = 0; i < base->n_common_timeouts; ++i) {
			struct common_timeout_list *ctl = base->common_timeout_queues[i];
			TAILQ_FOREACH(ev, &ctl->events,
				ev_timeout_pos.ev_next_with_common_timeout) {
				if (ev->ev_fd == fd) {
					event_active_nolock_(ev, EV_TIMEOUT, 1);
				}
			}
		}
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);
}